

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_udiv(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *res;
  BtorSimBitVector *local_10;
  
  local_10 = (BtorSimBitVector *)0x0;
  udiv_urem_bv(a,b,&local_10,(BtorSimBitVector **)0x0);
  return local_10;
}

Assistant:

BtorSimBitVector *
btorsim_bv_udiv (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0;
  udiv_urem_bv (a, b, &res, 0);
  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}